

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::EntrySort(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *scriptContext;
  CallInfo scriptContext_00;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  RecyclableObject *pRVar7;
  int in_stack_00000010;
  undefined1 local_80 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  WriteBarrierPtr<Js::RecyclableObject> local_48;
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *local_40;
  undefined1 local_38 [8];
  ArgumentReader args;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1b7d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a4b8a9;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_38,(CallInfo *)&__tag.entry.next,(Var *)&stack0x00000018);
  scriptContext_00 =
       (CallInfo)
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_80,function,(CallInfo)__tag.entry.next,
             L"Array.prototype.sort",&stack0x00000000);
  if (((ulong)__tag.entry.next & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1b81,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00a4b8a9;
    *puVar5 = 0;
  }
  if (((ulong)local_38 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1b83,"(args.Info.Count >= 1)","Should have at least one argument"
                               );
    if (!bVar3) goto LAB_00a4b8a9;
    *puVar5 = 0;
  }
  callInfo_local = scriptContext_00;
  if (((ulong)local_38 & 0xfffffe) != 0) {
    pvVar6 = Arguments::operator[]((Arguments *)local_38,1);
    bVar3 = JavascriptConversion::IsCallable(pvVar6);
    if (bVar3) {
      pvVar6 = Arguments::operator[]((Arguments *)local_38,1);
      pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
      local_48.ptr = (RecyclableObject *)0x0;
      if (pRVar7 != (RecyclableObject *)0x0) {
        Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet(&local_48,pRVar7);
        if (scriptContext_00 ==
            (CallInfo)
            (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr) {
          local_40 = compareVars;
        }
        else {
          local_40 = compareVarsCrossContext;
        }
        pvVar6 = Arguments::operator[]((Arguments *)local_38,0);
        pvVar6 = SortHelper<Memory::WriteBarrierPtr<void>>
                           (pvVar6,(CompareVarsInfo *)&callInfo_local);
        goto LAB_00a4b7fd;
      }
    }
    else {
      pvVar6 = Arguments::operator[]((Arguments *)local_38,1);
      if (pvVar6 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00a4b8a9;
        *puVar5 = 0;
      }
      bVar3 = TaggedInt::Is(pvVar6);
      if ((ulong)pvVar6 >> 0x32 != 0 || bVar3) {
LAB_00a4b895:
        JavascriptError::ThrowTypeError
                  ((ScriptContext *)scriptContext_00,-0x7ff5ec34,L"Array.prototype.sort");
      }
      pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
      if (pRVar7 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00a4b8a9;
        *puVar5 = 0;
      }
      TVar1 = ((pRVar7->type).ptr)->typeId;
      if (0x57 < (int)TVar1) {
        BVar4 = RecyclableObject::IsExternal(pRVar7);
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) {
LAB_00a4b8a9:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        goto LAB_00a4b895;
      }
      if (TVar1 != TypeIds_Undefined) goto LAB_00a4b895;
    }
  }
  local_48.ptr = (RecyclableObject *)0x0;
  local_40 = stringCompare;
  pvVar6 = Arguments::operator[]((Arguments *)local_38,0);
  pvVar6 = SortHelper<StringItem>(pvVar6,(CompareVarsInfo *)&callInfo_local);
LAB_00a4b7fd:
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_80);
  return pvVar6;
}

Assistant:

Var JavascriptArray::EntrySort(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Array.prototype.sort"));

        Assert(!(callInfo.Flags & CallFlags_New));

        AssertMsg(args.Info.Count >= 1, "Should have at least one argument");

        RecyclableObject* compFn = NULL;
        if (args.Info.Count > 1)
        {
            if (JavascriptConversion::IsCallable(args[1]))
            {
                compFn = UnsafeVarTo<RecyclableObject>(args[1]);
            }
            else
            {
                // Spec mandates that we throw if arg[1] is neither callable nor undefined
                if (JavascriptOperators::GetTypeId(args[1]) != TypeIds_Undefined)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.sort"));
                }
            }
        }

        // CompareVarsInfo struct holds data that will be used by sorting algorithm
        JavascriptArray::CompareVarsInfo cvInfo;
        cvInfo.scriptContext = scriptContext;
        if (compFn != NULL)
        {
            cvInfo.compFn = compFn;
            cvInfo.compareType = scriptContext == compFn->GetScriptContext() ? &compareVars : &compareVarsCrossContext;
            return JavascriptArray::SortHelper<Field(Var)>(args[0], &cvInfo);
        }
        else
        {
            cvInfo.compFn = nullptr;
            cvInfo.compareType = &stringCompare;
            return JavascriptArray::SortHelper<StringItem>(args[0], &cvInfo);
        }
    }